

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.c
# Opt level: O0

lws_mqtt_stateful_primitive_return_t lws_mqtt_mb_parse(lws_mqtt_vbi *vbi,uint8_t **in,size_t *len)

{
  char cVar1;
  uint32_t uVar2;
  byte *pbVar3;
  bool bVar4;
  size_t *len_local;
  uint8_t **in_local;
  lws_mqtt_vbi *vbi_local;
  
  if (vbi->budget == '\0') {
    vbi_local._4_4_ = LMSPR_FAILED_ALREADY_COMPLETED;
  }
  else {
    while( true ) {
      bVar4 = false;
      if (*len != 0) {
        cVar1 = vbi->budget;
        vbi->budget = cVar1 + -1;
        bVar4 = cVar1 != '\0';
      }
      if (!bVar4) break;
      uVar2 = vbi->value;
      pbVar3 = *in;
      *in = pbVar3 + 1;
      vbi->value = uVar2 << 8 | (uint)*pbVar3;
      *len = *len - 1;
      vbi->consumed = vbi->consumed + '\x01';
    }
    vbi_local._4_4_ = (lws_mqtt_stateful_primitive_return_t)(vbi->budget != '\0');
  }
  return vbi_local._4_4_;
}

Assistant:

lws_mqtt_stateful_primitive_return_t
lws_mqtt_mb_parse(lws_mqtt_vbi *vbi, const uint8_t **in, size_t *len)
{
	if (!vbi->budget)
		return LMSPR_FAILED_ALREADY_COMPLETED;

	while (*len && vbi->budget--) {
		vbi->value = (vbi->value << 8) | *((*in)++);
		(*len)--;
		vbi->consumed++;
	}

	return vbi->budget ? LMSPR_NEED_MORE : LMSPR_COMPLETED;
}